

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  U32 *rankStats;
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  U32 UVar11;
  size_t sVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  size_t sVar26;
  U32 *rankVal0;
  int iVar27;
  uint local_10c;
  U32 nbSymbols;
  U32 tableLog;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  sVar9 = 0xffffffffffffffd4;
  sVar26 = sVar9;
  if (0x5db < wkspSize) {
    uVar6 = *DTable;
    uVar10 = uVar6 & 0xff;
    rankStats = (U32 *)((long)workSpace + 0x270);
    *(undefined8 *)((long)workSpace + 0x2cc) = 0;
    *(undefined8 *)((long)workSpace + 0x2d4) = 0;
    *(undefined8 *)((long)workSpace + 0x2c0) = 0;
    *(undefined8 *)((long)workSpace + 0x2c8) = 0;
    *(undefined8 *)((long)workSpace + 0x2b0) = 0;
    *(undefined8 *)((long)workSpace + 0x2b8) = 0;
    *(undefined8 *)((long)workSpace + 0x2a0) = 0;
    *(undefined8 *)((long)workSpace + 0x2a8) = 0;
    *(undefined8 *)((long)workSpace + 0x290) = 0;
    *(undefined8 *)((long)workSpace + 0x298) = 0;
    *(undefined8 *)((long)workSpace + 0x280) = 0;
    *(undefined8 *)((long)workSpace + 0x288) = 0;
    rankStats[0] = 0;
    rankStats[1] = 0;
    *(undefined8 *)((long)workSpace + 0x278) = 0;
    if (((uVar10 < 0xd) &&
        (sVar12 = HUF_readStats((BYTE *)((long)workSpace + 0x4dc),0x100,rankStats,&nbSymbols,
                                &tableLog,src,srcSize), sVar26 = sVar12, sVar12 < 0xffffffffffffff89
        )) && (iVar15 = uVar10 - tableLog, sVar26 = sVar9, tableLog <= uVar10)) {
      uVar19 = 0;
      UVar11 = tableLog;
      do {
        uVar24 = (ulong)UVar11;
        UVar11 = UVar11 - 1;
        uVar19 = uVar19 + 1;
      } while (rankStats[uVar24] == 0);
      uVar24 = (ulong)((tableLog - uVar19) + 2);
      local_10c = 0;
      for (lVar18 = 0x9d; lVar18 - 0x9cU < uVar24; lVar18 = lVar18 + 1) {
        iVar27 = *(int *)((long)workSpace + lVar18 * 4);
        *(uint *)((long)workSpace + lVar18 * 4 + 0x38) = local_10c;
        local_10c = iVar27 + local_10c;
      }
      *(uint *)((long)workSpace + 0x2a8) = local_10c;
      for (uVar21 = 0; nbSymbols != uVar21; uVar21 = uVar21 + 1) {
        bVar13 = *(byte *)((long)workSpace + uVar21 + 0x4dc);
        uVar16 = *(uint *)((long)workSpace + (ulong)bVar13 * 4 + 0x2a8);
        *(uint *)((long)workSpace + (ulong)bVar13 * 4 + 0x2a8) = uVar16 + 1;
        *(char *)((long)workSpace + (ulong)uVar16 * 2 + 0x2dc) = (char)uVar21;
        *(byte *)((long)workSpace + (ulong)uVar16 * 2 + 0x2dd) = bVar13;
      }
      *(undefined4 *)((long)workSpace + 0x2a8) = 0;
      iVar27 = 0;
      for (uVar21 = 1; uVar21 < uVar24; uVar21 = uVar21 + 1) {
        iVar7 = *(int *)((long)workSpace + uVar21 * 4 + 0x270);
        bVar13 = (byte)iVar15;
        *(int *)((long)workSpace + uVar21 * 4) = iVar27;
        iVar15 = iVar15 + 1;
        iVar27 = (iVar7 << (bVar13 & 0x1f)) + iVar27;
      }
      iVar15 = tableLog + 1;
      lVar18 = (ulong)uVar19 * 0x34;
      for (uVar16 = uVar19; uVar21 = 1, uVar16 < (uVar10 - uVar19) + 1; uVar16 = uVar16 + 1) {
        for (; uVar21 < uVar24; uVar21 = uVar21 + 1) {
          *(uint *)((long)workSpace + uVar21 * 4 + lVar18) =
               *(uint *)((long)workSpace + uVar21 * 4) >> ((byte)uVar16 & 0x1f);
        }
        lVar18 = lVar18 + 0x34;
      }
      local_38 = *(undefined4 *)((long)workSpace + 0x30);
      local_48 = *(undefined8 *)((long)workSpace + 0x20);
      uStack_40 = *(undefined8 *)((long)workSpace + 0x28);
      local_58 = *(undefined8 *)((long)workSpace + 0x10);
      uStack_50 = *(undefined8 *)((long)workSpace + 0x18);
      local_68 = *workSpace;
      uStack_60 = *(undefined8 *)((long)workSpace + 8);
      for (uVar24 = 0; uVar24 != local_10c; uVar24 = uVar24 + 1) {
        bVar13 = *(byte *)((long)workSpace + uVar24 * 2 + 0x2dc);
        bVar3 = *(byte *)((long)workSpace + uVar24 * 2 + 0x2dd);
        uVar25 = iVar15 - (uint)bVar3;
        uVar16 = *(uint *)((long)&local_68 + (ulong)bVar3 * 4);
        uVar21 = (ulong)uVar16;
        bVar14 = (byte)(uVar10 - uVar25);
        iVar27 = 1 << (bVar14 & 0x1f);
        if (uVar10 - uVar25 < uVar19) {
          for (; uVar21 < iVar27 + uVar16; uVar21 = uVar21 + 1) {
            DTable[uVar21 + 1] = (uVar25 & 0xff) * 0x10000 + (uint)bVar13 + 0x1000000;
          }
        }
        else {
          uVar22 = uVar25 + (iVar15 - uVar10);
          uVar17 = 1;
          if (1 < (int)uVar22) {
            uVar17 = uVar22;
          }
          uVar8 = *(uint *)((long)workSpace + (ulong)uVar17 * 4 + 0x2a4);
          lVar18 = (ulong)uVar25 * 0x34;
          local_78 = *(undefined4 *)((long)workSpace + lVar18 + 0x30);
          puVar1 = (undefined8 *)((long)workSpace + lVar18 + 0x10);
          puVar2 = (undefined8 *)((long)workSpace + lVar18 + 0x20);
          local_88 = *puVar2;
          uStack_80 = puVar2[1];
          local_98 = *puVar1;
          uStack_90 = puVar1[1];
          local_a8 = *(undefined8 *)((long)workSpace + lVar18);
          uStack_a0 = ((undefined8 *)((long)workSpace + lVar18))[1];
          if (1 < (int)uVar22) {
            uVar17 = *(uint *)((long)&local_a8 + (ulong)uVar17 * 4);
            for (uVar23 = 0; uVar17 != uVar23; uVar23 = uVar23 + 1) {
              DTable[uVar21 + uVar23 + 1] = (uVar25 & 0xff) * 0x10000 + (uint)bVar13 + 0x1000000;
            }
          }
          lVar18 = (ulong)uVar8 * 2;
          for (uVar23 = 0; uVar23 != local_10c - uVar8; uVar23 = uVar23 + 1) {
            bVar4 = *(byte *)((long)workSpace + uVar23 * 2 + lVar18 + 0x2dc);
            bVar5 = *(byte *)((long)workSpace + uVar23 * 2 + lVar18 + 0x2dd);
            uVar17 = *(uint *)((long)&local_a8 + (ulong)bVar5 * 4);
            uVar22 = (1 << (bVar14 - (char)(iVar15 - (uint)bVar5) & 0x1f)) + uVar17;
            do {
              uVar20 = (ulong)uVar17;
              uVar17 = uVar17 + 1;
              DTable[uVar21 + uVar20 + 1] =
                   (uint)bVar13 +
                   (((iVar15 - (uint)bVar5) + uVar25 & 0xff) << 0x10 | (uint)bVar4 << 8) + 0x2000000
              ;
            } while (uVar17 < uVar22);
            *(uint *)((long)&local_a8 + (ulong)bVar5 * 4) = uVar22;
          }
        }
        *(uint *)((long)&local_68 + (ulong)bVar3 * 4) = iVar27 + uVar16;
      }
      *(char *)DTable = (char)uVar6;
      *(undefined1 *)((long)DTable + 1) = 1;
      *(char *)((long)DTable + 2) = (char)uVar6;
      *(char *)((long)DTable + 3) = (char)(uVar6 >> 0x18);
      sVar26 = sVar12;
    }
  }
  return sVar26;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    rankValCol_t* rankVal;
    U32* rankStats;
    U32* rankStart0;
    sortedSymbol_t* sortedSymbol;
    BYTE* weightList;
    size_t spaceUsed32 = 0;

    rankVal = (rankValCol_t *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += (sizeof(rankValCol_t) * HUF_TABLELOG_MAX) >> 2;
    rankStats = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 1;
    rankStart0 = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 2;
    sortedSymbol = (sortedSymbol_t *)workSpace + (spaceUsed32 * sizeof(U32)) / sizeof(sortedSymbol_t);
    spaceUsed32 += HUF_ALIGN(sizeof(sortedSymbol_t) * (HUF_SYMBOLVALUE_MAX + 1), sizeof(U32)) >> 2;
    weightList = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    rankStart = rankStart0 + 1;
    memset(rankStats, 0, sizeof(U32) * (2 * HUF_TABLELOG_MAX + 2 + 1));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(weightList, HUF_SYMBOLVALUE_MAX + 1, rankStats, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 current = nextRankStart;
            nextRankStart += rankStats[w];
            rankStart[w] = current;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = weightList[s];
            U32 const r = rankStart[w]++;
            sortedSymbol[r].symbol = (BYTE)s;
            sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 current = nextRankVal;
                nextRankVal += rankStats[w] << (w+rescale);
                rankVal0[w] = current;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   sortedSymbol, sizeOfSort,
                   rankStart0, rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}